

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

TRef lj_opt_dse_fstore(jit_State *J)

{
  ushort uVar1;
  short sVar2;
  ushort uVar3;
  long lVar4;
  uint8_t uVar5;
  TRef TVar6;
  jit_State *pjVar7;
  long in_RDI;
  IRIns *ir;
  IRIns *store;
  IRRef ref;
  IRRef1 *refp;
  IRIns *xr;
  IRRef val;
  IRRef fref;
  undefined4 in_stack_ffffffffffffffb8;
  AliasRet in_stack_ffffffffffffffbc;
  IRIns *in_stack_ffffffffffffffc0;
  jit_State *J_00;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar8;
  uint8_t *local_28;
  
  uVar1 = *(ushort *)(in_RDI + 0x98);
  sVar2 = *(short *)(in_RDI + 0x9a);
  lVar4 = *(long *)(in_RDI + 0x10);
  local_28 = (uint8_t *)(in_RDI + 0x1d4);
  uVar3 = *(ushort *)local_28;
  while (uVar8 = (uint)uVar3, uVar1 < uVar8) {
    J_00 = (jit_State *)(*(long *)(in_RDI + 0x10) + (ulong)uVar8 * 8);
    in_stack_ffffffffffffffbc =
         aa_fref(J_00,in_stack_ffffffffffffffc0,
                 (IRIns *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (in_stack_ffffffffffffffbc != ALIAS_NO) {
      if (in_stack_ffffffffffffffbc == ALIAS_MAY) {
        if (*(short *)((long)&(J_00->cur).nextgc.gcptr32 + 2) != sVar2) break;
      }
      else if (in_stack_ffffffffffffffbc == ALIAS_MUST) {
        if (*(short *)((long)&(J_00->cur).nextgc.gcptr32 + 2) == sVar2) {
          return 4;
        }
        if (*(ushort *)(in_RDI + 0x162) < uVar8) {
          pjVar7 = (jit_State *)(*(long *)(in_RDI + 0x10) + (ulong)(*(int *)(in_RDI + 8) - 1) * 8);
          goto LAB_00143110;
        }
        break;
      }
    }
    local_28 = &(J_00->cur).topslot;
    uVar3._0_1_ = (J_00->cur).topslot;
    uVar3._1_1_ = (J_00->cur).linktype;
  }
LAB_001431cc:
  TVar6 = lj_ir_emit((jit_State *)CONCAT44(uVar8,in_stack_ffffffffffffffd0));
  return TVar6;
LAB_00143110:
  if (pjVar7 <= J_00) goto LAB_00143167;
  if ((((pjVar7->cur).marked & 0x80) != 0) ||
     (((pjVar7->cur).gct == 'C' &&
      (*(short *)((long)&(pjVar7->cur).nextgc.gcptr32 + 2) ==
       *(short *)(lVar4 + (ulong)(uint)uVar1 * 8 + 2))))) goto LAB_001431cc;
  pjVar7 = (jit_State *)&pjVar7[-1].errinfo;
  goto LAB_00143110;
LAB_00143167:
  uVar5 = (J_00->cur).linktype;
  local_28[0] = (J_00->cur).topslot;
  local_28[1] = uVar5;
  (J_00->cur).gct = '\f';
  (J_00->cur).marked = '\0';
  *(undefined2 *)((long)&(J_00->cur).nextgc.gcptr32 + 2) = 0;
  *(undefined2 *)&(J_00->cur).nextgc.gcptr32 = 0;
  (J_00->cur).topslot = '\0';
  (J_00->cur).linktype = '\0';
  goto LAB_001431cc;
}

Assistant:

TRef LJ_FASTCALL lj_opt_dse_fstore(jit_State *J)
{
  IRRef fref = fins->op1;  /* FREF reference. */
  IRRef val = fins->op2;  /* Stored value reference. */
  IRIns *xr = IR(fref);
  IRRef1 *refp = &J->chain[IR_FSTORE];
  IRRef ref = *refp;
  while (ref > fref) {  /* Search for redundant or conflicting stores. */
    IRIns *store = IR(ref);
    switch (aa_fref(J, xr, IR(store->op1))) {
    case ALIAS_NO:
      break;  /* Continue searching. */
    case ALIAS_MAY:
      if (store->op2 != val)  /* Conflict if the value is different. */
	goto doemit;
      break;  /* Otherwise continue searching. */
    case ALIAS_MUST:
      if (store->op2 == val)  /* Same value: drop the new store. */
	return DROPFOLD;
      /* Different value: try to eliminate the redundant store. */
      if (ref > J->chain[IR_LOOP]) {  /* Quick check to avoid crossing LOOP. */
	IRIns *ir;
	/* Check for any intervening guards or conflicting loads. */
	for (ir = IR(J->cur.nins-1); ir > store; ir--)
	  if (irt_isguard(ir->t) || (ir->o == IR_FLOAD && ir->op2 == xr->op2))
	    goto doemit;  /* No elimination possible. */
	/* Remove redundant store from chain and replace with NOP. */
	*refp = store->prev;
	store->o = IR_NOP;
	store->t.irt = IRT_NIL;
	store->op1 = store->op2 = 0;
	store->prev = 0;
	/* Now emit the new store instead. */
      }
      goto doemit;
    }
    ref = *(refp = &store->prev);
  }
doemit:
  return EMITFOLD;  /* Otherwise we have a conflict or simply no match. */
}